

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

vm_obj_id_t CVmObjDate::create_from_stack(uchar **pc_ptr,uint argc)

{
  byte bVar1;
  int32_t *piVar2;
  undefined1 auVar3 [16];
  int32_t *piVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  vm_obj_id_t obj_id;
  int iVar9;
  char *str;
  CVmTimeZone *pCVar10;
  short *psVar11;
  undefined8 *puVar12;
  undefined4 extraout_var;
  int32_t *in_RCX;
  int32_t refday;
  int32_t reftime;
  double dVar14;
  double dVar15;
  int32_t daytime;
  int32_t dayno;
  CVmDateLocale lc;
  gregcaldate_t cal;
  int local_98;
  undefined1 local_94;
  int local_80;
  undefined1 local_7c;
  bignum_t<32> local_68;
  undefined1 local_50 [28];
  undefined4 local_34;
  int *piVar13;
  
  piVar4 = (int32_t *)(ulong)argc;
  if (argc == 0) {
    os_time_ns((time_t *)local_50,(long *)&local_68);
    iVar8 = (int)(SUB168(SEXT816((long)local_50._0_8_) * SEXT816(0x1845c8a0ce512957),8) >> 0xd);
    iVar5 = SUB164(SEXT816((long)local_50._0_8_) * SEXT816(0x1845c8a0ce512957),0xc) >> 0x1f;
    local_80 = (iVar8 - iVar5) + 0xafa6c;
    auVar3 = SEXT816(0x431bde82d7b634db) *
             SEXT816(CONCAT44(local_68.ext._4_4_,CONCAT22(local_68.ext._2_2_,local_68.ext._0_2_)));
    local_98 = ((int)(auVar3._8_8_ >> 0x12) - (auVar3._12_4_ >> 0x1f)) +
               ((int)local_50._0_8_ + (iVar8 - iVar5) * -0x15180) * 1000;
    goto LAB_002873af;
  }
  if (3 < argc) {
LAB_00286ec7:
    if ((((((argc | 4) == 7) &&
          ((sp_[-1].typ == VM_INT || (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -1), iVar8 != 0))))
         && ((sp_[-2].typ == VM_INT || (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -2), iVar8 != 0)))
         ) && ((sp_[-3].typ == VM_INT || (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -3), iVar8 != 0)
               ))) &&
       ((in_RCX = (int32_t *)0x3, argc == 3 ||
        (((((sp_[-4].typ == VM_INT || (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -4), iVar8 != 0))
           && ((sp_[-5].typ == VM_INT || (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -5), iVar8 != 0)
               ))) &&
          ((sp_[-6].typ == VM_INT || (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -6), iVar8 != 0))))
         && ((in_RCX = piVar4, sp_[-7].typ == VM_INT ||
             (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -7), iVar8 != 0)))))))) {
      parse_ymd_args((int)in_RCX,(int)&local_80,&local_98,in_RCX);
      pCVar10 = CVmTimeZoneCache::get_local_zone(G_tzcache_X);
    }
    else {
      if (((((argc != 8) && (argc != 4)) ||
           ((sp_[-1].typ != VM_INT && (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -1), iVar8 == 0))))
          || (((sp_[-2].typ != VM_INT && (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -2), iVar8 == 0)
               ) || ((sp_[-3].typ != VM_INT &&
                     (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -3), iVar8 == 0)))))) ||
         ((argc != 4 &&
          ((((sp_[-4].typ != VM_INT && (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -4), iVar8 == 0))
            || ((sp_[-5].typ != VM_INT &&
                (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -5), iVar8 == 0)))) ||
           (((sp_[-6].typ != VM_INT && (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -6), iVar8 == 0))
            || ((sp_[-7].typ != VM_INT &&
                (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -7), iVar8 == 0)))))))))) {
LAB_00287430:
        err_throw(0x900);
      }
      parse_ymd_args(argc - 1,(int)&local_80,&local_98,in_RCX);
      pCVar10 = get_tz_arg(argc - 1,argc);
    }
    CVmTimeZone::local_to_utc(pCVar10,&local_80,&local_98);
    goto LAB_002873af;
  }
  str = vm_val_t::get_as_string(sp_ + -1);
  if (str != (char *)0x0) {
    if ((argc == 1) || (sp_[-2].typ == VM_NIL)) {
      pCVar10 = CVmTimeZoneCache::get_local_zone(G_tzcache_X);
    }
    else {
      pCVar10 = get_tz_arg(1,argc);
    }
    if ((argc == 3) && (sp_[-3].typ != VM_NIL)) {
      if ((sp_[-3].typ != VM_OBJ) ||
         (iVar8 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc]
                                         [sp_[-3].val.obj & 0xfff].ptr_ + 8))
                            (G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc] +
                             (sp_[-3].val.obj & 0xfff),metaclass_reg_), iVar8 == 0))
      goto LAB_00287430;
      if (G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc] == (CVmObjPageEntry *)0x0) goto LAB_00287430;
      piVar2 = *(int32_t **)
                ((long)&G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc][sp_[-3].val.obj & 0xfff].ptr_ +
                8);
      refday = *piVar2;
      reftime = piVar2[1];
    }
    else {
      os_time_ns((time_t *)local_50,(long *)&local_68);
      iVar8 = (int)(SUB168(SEXT816((long)local_50._0_8_) * SEXT816(0x1845c8a0ce512957),8) >> 0xd);
      iVar5 = SUB164(SEXT816((long)local_50._0_8_) * SEXT816(0x1845c8a0ce512957),0xc) >> 0x1f;
      refday = (iVar8 - iVar5) + 0xafa6c;
      auVar3 = SEXT816(0x431bde82d7b634db) *
               SEXT816(CONCAT44(local_68.ext._4_4_,CONCAT22(local_68.ext._2_2_,local_68.ext._0_2_)))
      ;
      reftime = ((int)(auVar3._8_8_ >> 0x12) - (auVar3._12_4_ >> 0x1f)) +
                ((int)local_50._0_8_ + (iVar8 - iVar5) * -0x15180) * 1000;
    }
    CVmDateLocale::CVmDateLocale((CVmDateLocale *)&local_68);
    local_50._0_8_ = &PTR__multicaldate_t_00364828;
    local_50._20_8_ = 0x300000000;
    local_34 = 1;
    iVar8 = parse_date_string(&local_80,&local_98,str,(vm_val_t *)0x0,(CVmDateLocale *)&local_68,
                              (multicaldate_t *)local_50,refday,reftime,pCVar10,
                              (date_parse_result *)0x0,(date_parse_string *)0x0,(int *)0x0);
    if (iVar8 == 0) {
LAB_00287240:
      err_throw(0x902);
    }
    goto LAB_002873af;
  }
  if (argc != 2) goto LAB_00286ec7;
  if (((sp_[-1].typ != VM_INT) && (iVar8 = vm_val_t::nonint_is_numeric(sp_ + -1), iVar8 == 0)) ||
     (psVar11 = (short *)vm_val_t::get_as_string(sp_ + -2), psVar11 == (short *)0x0))
  goto LAB_00287430;
  if (*psVar11 != 1) goto LAB_00287240;
  bVar1 = *(byte *)(psVar11 + 1);
  if (bVar1 < 0x6a) {
    if (bVar1 == 0x4a) goto LAB_0028726c;
    if (bVar1 != 0x55) goto LAB_00287240;
LAB_00287254:
    if (sp_[-1].typ == VM_INT) {
      dVar14 = (double)sp_[-1].val.intval;
    }
    else {
      dVar14 = vm_val_t::nonint_num_to_double(sp_ + -1);
    }
    dVar15 = floor(dVar14 / 86400.0);
    dVar14 = (dVar14 - dVar15 * 86400.0) * 1000.0;
    dVar15 = dVar15 + 719468.0;
  }
  else {
    if (bVar1 != 0x6a) {
      if (bVar1 != 0x75) goto LAB_00287240;
      goto LAB_00287254;
    }
LAB_0028726c:
    local_68.ext[0] = ' ';
    local_68.ext[1] = '\0';
    local_68.ext._4_4_ = local_68.ext._4_4_ & 0xffffff00;
    bignum_t<32>::set(&local_68,sp_ + -1);
    bignum_t<32>::operator-=(&local_68,1721119.5);
    dVar14 = CVmObjBigNum::ext_to_double(local_68.ext);
    dVar15 = floor(dVar14);
    uVar6 = local_50._0_8_;
    local_50._0_2_ = 0x20;
    uVar7 = local_50._0_8_;
    local_50._5_3_ = SUB83(uVar6,5);
    local_50._0_4_ = (undefined4)uVar7;
    local_50[4] = 0;
    CVmObjBigNum::set_double_val(local_50,dVar15);
    local_98 = CONCAT22(local_98._2_2_,0x20);
    local_94 = 0;
    CVmObjBigNum::compute_diff_into((char *)&local_98,local_68.ext,local_50);
    uVar6 = local_50._0_8_;
    local_50._0_2_ = 0x20;
    uVar7 = local_50._0_8_;
    local_50._5_3_ = SUB83(uVar6,5);
    local_50._0_4_ = (undefined4)uVar7;
    local_50[4] = 0;
    CVmObjBigNum::set_int_val(local_50,86400000);
    local_80 = CONCAT22(local_80._2_2_,0x20);
    local_7c = 0;
    CVmObjBigNum::compute_prod_into((char *)&local_80,(char *)&local_98,local_50);
    dVar14 = CVmObjBigNum::ext_to_double((char *)&local_80);
  }
  if ((2147483647.0 < dVar15) || (dVar15 < -2147483648.0)) {
    err_throw(0x7e7);
  }
  local_80 = (int)dVar15;
  local_98 = round_int32(dVar14);
LAB_002873af:
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,0,0);
  puVar12 = (undefined8 *)CVmObject::operator_new(0x10,obj_id);
  iVar5 = local_80;
  iVar8 = local_98;
  *puVar12 = &PTR_get_metaclass_reg_003644e0;
  iVar9 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,8,puVar12);
  piVar13 = (int *)CONCAT44(extraout_var,iVar9);
  puVar12[1] = piVar13;
  *piVar13 = iVar5;
  piVar13[1] = iVar8;
  sp_ = sp_ + -(long)piVar4;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjDate::create_from_stack(VMG_ const uchar **pc_ptr, uint argc)
{
    int32_t dayno;
    int32_t daytime;
    const char *str;
    
    /* check for the various argument lists */
    if (argc == 0)
    {
        /* no arguments - get the current date and time in the local zone */
        caldate_t::now(dayno, daytime);
    }
    else if ((argc >= 1 && argc <= 3)
             && (str = G_stk->get(0)->get_as_string(vmg0_)) != 0)
    {
        /* 
         *   The first argument is a date in string format.  The optional
         *   second argument is the reference time zone; the optional third
         *   argument is the reference date.
         */

        /* get the reference time zone */
        CVmTimeZone *reftz;
        if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
            reftz = get_tz_arg(vmg_ 1, argc);
        else
            reftz = G_tzcache->get_local_zone(vmg0_);

        /* get the reference date */
        int32_t refday, reftime;
        if (argc >= 3 && G_stk->get(2)->typ != VM_NIL)
        {
            /* get the reference Date object */
            CVmObjDate *refdate = vm_val_cast(CVmObjDate, G_stk->get(2));
            if (refdate == 0)
                err_throw(VMERR_BAD_TYPE_BIF);

            /* take the reference point from the Date object */
            refday = refdate->get_ext()->dayno;
            reftime = refdate->get_ext()->daytime;
        }
        else
        {
            /* no reference date, so use the current time */
            caldate_t::now(refday, reftime);
        }

        /* parse the format */
        CVmDateLocale lc Pvmg0_P;
        gregcaldate_t cal;
        if (!parse_date_string(vmg_ dayno, daytime, str, 0, &lc, &cal,
                               refday, reftime, reftz, 0, 0, 0))
            err_throw(VMERR_BAD_VAL_BIF);
    }
    else if (argc == 2
             && G_stk->get(0)->is_numeric(vmg0_)
             && (str = G_stk->get(1)->get_as_string(vmg0_)) != 0)
    {
        /* check the type code */
        double dn, dms;
        if (vmb_get_len(str) == 1 && (str[2] == 'U' || str[2] == 'u'))
        {
            /* 
             *   'U' - Unix time, as seconds past 1/1/1970, UTC.  Get the
             *   argument as a double, and convert it to our day numbering
             *   scheme by dividing by seconds per day and adding the Unix
             *   Epoch's day number.  (An ordinary double is big enough to
             *   hold the largest Unix seconds-since-Epoch value we can
             *   represent: our range is limited by the 32-bit day number, so
             *   in terms of seconds that's (2^31-1)*86400, which needs about
             *   49 bits.  A standard double's mantissa is 52 bits, so it can
             *   represent any integer in our range exactly.)
             */
            double d = G_stk->get(0)->num_to_double(vmg0_);
            dn = floor(d / (24*60*60));
            dms = (d - (dn * (24*60*60))) * 1000;
            dn += caldate_t::UNIX_EPOCH_DAYNO;
        }
        else if (vmb_get_len(str) == 1 && (str[2] == 'J' || str[2] == 'j'))
        {
            /* 
             *   'J' - Julian day number; get the value, and adjust it to our
             *   Epoch by subtracting the Julian day number of our Epoch.
             *   The whole part is our day number; the fractional part is the
             *   fraction of a day past midnight (the .5 in the Epoch
             *   adjustment recalibrates from noon to midnight).
             */
            bignum_t<32> bdayno(vmg_ G_stk->get(0));
            bdayno -= 1721119.5;
            dn = floor((double)bdayno);
            dms = (double)((bdayno - dn) * (long)(24*60*60*1000));
        }
        else
        {
            /* unrecognized code */
            err_throw(VMERR_BAD_VAL_BIF);
        }

        /* make sure the day number fits an int32 */
        if (dn > INT32MAXVAL || dn < INT32MINVAL)
            err_throw(VMERR_NUM_OVERFLOW);
        dayno = (int32_t)dn;
        
        /* convert milliseconds to int32 */
        daytime = round_int32(dms);
    }
    else if ((argc == 3 || argc == 7)
             && G_stk->get(0)->is_numeric(vmg0_)
             && G_stk->get(1)->is_numeric(vmg0_)
             && G_stk->get(2)->is_numeric(vmg0_)
             && (argc == 3
                 || (G_stk->get(3)->is_numeric(vmg0_)
                     && G_stk->get(4)->is_numeric(vmg0_)
                     && G_stk->get(5)->is_numeric(vmg0_)
                     && G_stk->get(6)->is_numeric(vmg0_))))
    {
        /* parse the Y/M/D or Y/M/D HH:MI:SS arguments */
        parse_ymd_args(vmg_ 0, argc, dayno, daytime);

        /* convert from the local time zone to UTC */
        G_tzcache->get_local_zone(vmg0_)->local_to_utc(dayno, daytime);
    }
    else if ((argc == 4 || argc == 8)
             && G_stk->get(0)->is_numeric(vmg0_)
             && G_stk->get(1)->is_numeric(vmg0_)
             && G_stk->get(2)->is_numeric(vmg0_)
             && (argc == 4
                 || (G_stk->get(3)->is_numeric(vmg0_)
                     && G_stk->get(4)->is_numeric(vmg0_)
                     && G_stk->get(5)->is_numeric(vmg0_)
                     && G_stk->get(6)->is_numeric(vmg0_))))
    {
        /* parse the Y/M/D or Y/M/D HH:MI:SS arguments */
        parse_ymd_args(vmg_ 0, argc - 1, dayno, daytime);

        /* convert from the given time zone to UTC */
        get_tz_arg(vmg_ argc - 1, argc)->local_to_utc(dayno, daytime);
    }
    else
    {
        /* wrong arguments */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* create the object */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
    new (vmg_ id) CVmObjDate(vmg_ dayno, daytime);

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new ID */
    return id;
}